

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfWav.cpp
# Opt level: O1

void Imf_3_4::wav2Decode(unsigned_short *in,int nx,int ox,int ny,int oy,unsigned_short mx)

{
  ushort *puVar1;
  uint uVar2;
  short hs_2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  short sVar12;
  uint uVar13;
  short hs_1;
  ushort *puVar14;
  ushort *puVar15;
  
  iVar4 = ny;
  if (nx < ny) {
    iVar4 = nx;
  }
  iVar5 = 1;
  do {
    iVar6 = iVar5;
    iVar5 = iVar6 * 2;
  } while (iVar6 <= iVar4);
  if (0 < iVar6 >> 2) {
    uVar2 = iVar6 >> 2;
    uVar13 = iVar6 >> 1;
    do {
      uVar3 = uVar2;
      iVar4 = (ny - uVar13) * oy;
      iVar5 = uVar3 * ox;
      puVar15 = in;
      if (-1 < iVar4) {
        iVar6 = uVar3 * oy;
        iVar7 = (nx - uVar13) * ox;
        do {
          puVar14 = puVar15;
          if (-1 < iVar7) {
            do {
              puVar1 = puVar14 + iVar6;
              uVar11 = puVar14[iVar6];
              if (mx < 0x4000) {
                sVar12 = ((short)uVar11 >> 1) + *puVar14 + (uVar11 & 1);
                uVar10 = puVar1[iVar5];
                uVar9 = ((short)uVar10 >> 1) + (uVar10 & 1) + puVar14[iVar5];
                uVar8 = ((short)uVar9 >> 1) + (uVar9 & 1) + sVar12;
                *puVar14 = uVar8;
                uVar10 = uVar9 - uVar10;
                puVar14[iVar5] = uVar8 - uVar9;
                uVar11 = ((short)uVar10 >> 1) + (uVar10 & 1) + (sVar12 - uVar11);
                *puVar1 = uVar11;
                puVar1[iVar5] = uVar11 - uVar10;
              }
              else {
                sVar12 = *puVar14 - (uVar11 >> 1);
                uVar10 = puVar14[iVar5] - (puVar1[iVar5] >> 1);
                uVar9 = puVar1[iVar5] + uVar10 ^ 0x8000;
                uVar11 = (sVar12 + uVar11 ^ 0x8000) - (uVar9 >> 1);
                puVar14[iVar5] = uVar11;
                *puVar14 = uVar11 + uVar9 ^ 0x8000;
                uVar11 = sVar12 - (uVar10 >> 1);
                puVar1[iVar5] = uVar11;
                *puVar1 = uVar11 + uVar10 ^ 0x8000;
              }
              puVar14 = puVar14 + (int)(uVar13 * ox);
            } while (puVar14 <= puVar15 + iVar7);
          }
          if ((nx & uVar3) != 0) {
            uVar11 = puVar14[iVar6];
            if (mx < 0x4000) {
              uVar9 = ((short)uVar11 >> 1) + *puVar14 + (uVar11 & 1);
              uVar10 = uVar9 - uVar11;
            }
            else {
              uVar10 = *puVar14 - (uVar11 >> 1);
              uVar9 = uVar10 + uVar11 ^ 0x8000;
            }
            puVar14[iVar6] = uVar10;
            *puVar14 = uVar9;
          }
          puVar15 = puVar15 + (int)(uVar13 * oy);
        } while (puVar15 <= in + iVar4);
      }
      if (((uVar3 & ny) != 0) && (iVar4 = (nx - uVar13) * ox, -1 < iVar4)) {
        puVar14 = puVar15 + iVar4;
        do {
          uVar11 = puVar15[iVar5];
          if (mx < 0x4000) {
            uVar9 = ((short)uVar11 >> 1) + *puVar15 + (uVar11 & 1);
            uVar10 = uVar9 - uVar11;
          }
          else {
            uVar10 = *puVar15 - (uVar11 >> 1);
            uVar9 = uVar10 + uVar11 ^ 0x8000;
          }
          puVar15[iVar5] = uVar10;
          *puVar15 = uVar9;
          puVar15 = puVar15 + (int)(uVar13 * ox);
        } while (puVar15 <= puVar14);
      }
      uVar2 = uVar3 >> 1;
      uVar13 = uVar3;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

void
wav2Decode (
    unsigned short* in, // io: values are transformed in place
    int             nx, // i : x size
    int             ox, // i : x offset
    int             ny, // i : y size
    int             oy, // i : y offset
    unsigned short  mx)  // i : maximum in[x][y] value
{
    bool w14 = (mx < (1 << 14));
    int  n   = (nx > ny) ? ny : nx;
    int  p   = 1;
    int  p2;

    //
    // Search max level
    //

    while (p <= n)
        p <<= 1;

    p >>= 1;
    p2 = p;
    p >>= 1;

    //
    // Hierarchical loop on smaller dimension n
    //

    while (p >= 1)
    {
        unsigned short* py  = in;
        unsigned short* ey  = in + oy * (ny - p2);
        int             oy1 = oy * p;
        int             oy2 = oy * p2;
        int             ox1 = ox * p;
        int             ox2 = ox * p2;
        unsigned short  i00, i01, i10, i11;

        //
        // Y loop
        //

        for (; py <= ey; py += oy2)
        {
            unsigned short* px = py;
            unsigned short* ex = py + ox * (nx - p2);

            //
            // X loop
            //

            for (; px <= ex; px += ox2)
            {
                unsigned short* p01 = px + ox1;
                unsigned short* p10 = px + oy1;
                unsigned short* p11 = p10 + ox1;

                //
                // 2D wavelet decoding
                //

                if (w14)
                {
                    wdec14 (*px, *p10, i00, i10);
                    wdec14 (*p01, *p11, i01, i11);
                    wdec14 (i00, i01, *px, *p01);
                    wdec14 (i10, i11, *p10, *p11);
                }
                else
                {
                    wdec16 (*px, *p10, i00, i10);
                    wdec16 (*p01, *p11, i01, i11);
                    wdec16 (i00, i01, *px, *p01);
                    wdec16 (i10, i11, *p10, *p11);
                }
            }

            //
            // Decode (1D) odd column (still in Y loop)
            //

            if (nx & p)
            {
                unsigned short* p10 = px + oy1;

                if (w14)
                    wdec14 (*px, *p10, i00, *p10);
                else
                    wdec16 (*px, *p10, i00, *p10);

                *px = i00;
            }
        }

        //
        // Decode (1D) odd line (must loop in X)
        //

        if (ny & p)
        {
            unsigned short* px = py;
            unsigned short* ex = py + ox * (nx - p2);

            for (; px <= ex; px += ox2)
            {
                unsigned short* p01 = px + ox1;

                if (w14)
                    wdec14 (*px, *p01, i00, *p01);
                else
                    wdec16 (*px, *p01, i00, *p01);

                *px = i00;
            }
        }

        //
        // Next level
        //

        p2 = p;
        p >>= 1;
    }
}